

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O1

void uv_loadavg(double *avg)

{
  int iVar1;
  sysinfo info;
  char buf [128];
  sysinfo sStack_f8;
  char local_88 [128];
  
  iVar1 = uv__slurp("/proc/loadavg",local_88,0x80);
  if ((iVar1 == 0) && (iVar1 = sscanf(local_88,"%lf %lf %lf",avg,avg + 1,avg + 2), iVar1 == 3)) {
    return;
  }
  iVar1 = sysinfo(&sStack_f8);
  if (-1 < iVar1) {
    *avg = (((double)CONCAT44(0x45300000,(int)(sStack_f8.loads[0] >> 0x20)) - 1.9342813113834067e+25
            ) + ((double)CONCAT44(0x43300000,(int)sStack_f8.loads[0]) - 4503599627370496.0)) *
           1.52587890625e-05;
    avg[1] = (((double)CONCAT44(0x45300000,(int)(sStack_f8.loads[1] >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sStack_f8.loads[1]) - 4503599627370496.0)) *
             1.52587890625e-05;
    avg[2] = (((double)CONCAT44(0x45300000,(int)(sStack_f8.loads[2] >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sStack_f8.loads[2]) - 4503599627370496.0)) *
             1.52587890625e-05;
  }
  return;
}

Assistant:

void uv_loadavg(double avg[3]) {
  struct sysinfo info;
  char buf[128];  /* Large enough to hold all of /proc/loadavg. */

  if (0 == uv__slurp("/proc/loadavg", buf, sizeof(buf)))
    if (3 == sscanf(buf, "%lf %lf %lf", &avg[0], &avg[1], &avg[2]))
      return;

  if (sysinfo(&info) < 0)
    return;

  avg[0] = (double) info.loads[0] / 65536.0;
  avg[1] = (double) info.loads[1] / 65536.0;
  avg[2] = (double) info.loads[2] / 65536.0;
}